

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O2

char * XPMPLoadCSLPackage(char *inCSLFolder)

{
  char *pcVar1;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  if (inCSLFolder == (char *)0x0) {
    pcVar1 = "<nullptr> provided";
  }
  else {
    if (XPMP2::glob < 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,inCSLFolder,&local_49);
      XPMP2::StripXPSysDir(&local_48,&local_28);
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                    ,0xf8,"XPMPLoadCSLPackage",logINFO,"Loading CSL package from %s",
                    local_48._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_28);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,inCSLFolder,(allocator<char> *)&local_28);
    pcVar1 = XPMP2::CSLModelsLoad(&local_48,5);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return pcVar1;
}

Assistant:

const char *    XPMPLoadCSLPackage(const char * inCSLFolder)
{
    // Do load the CSL Models in the given path
    if (inCSLFolder) {
        LOG_MSG(logINFO, INFO_LOAD_CSL_PACKAGE, StripXPSysDir(inCSLFolder).c_str());
        return CSLModelsLoad(inCSLFolder);
    }
    else
        return "<nullptr> provided";
}